

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

bool __thiscall cmNinjaTargetGenerator::NeedDepTypeMSVC(cmNinjaTargetGenerator *this,string *lang)

{
  int iVar1;
  cmMakefile *this_00;
  char *__s1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  local_18 = lang;
  lang_local = (string *)this;
  this_00 = GetMakefile(this);
  std::operator+(&local_38,"CMAKE_NINJA_DEPTYPE_",local_18);
  __s1 = cmMakefile::GetSafeDefinition(this_00,&local_38);
  iVar1 = strcmp(__s1,"msvc");
  std::__cxx11::string::~string((string *)&local_38);
  return iVar1 == 0;
}

Assistant:

bool cmNinjaTargetGenerator::NeedDepTypeMSVC(const std::string& lang) const
{
  return strcmp(this->GetMakefile()->GetSafeDefinition("CMAKE_NINJA_DEPTYPE_" +
                                                       lang),
                "msvc") == 0;
}